

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::InternalSwap
          (TreeEnsembleClassifier *this,TreeEnsembleClassifier *other)

{
  TreeEnsembleClassifier *other_local;
  TreeEnsembleClassifier *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::internal::memswap<12>
            ((char *)&this->treeensemble_,(char *)&other->treeensemble_);
  std::swap<CoreML::Specification::TreeEnsembleClassifier::ClassLabelsUnion>
            (&this->ClassLabels_,&other->ClassLabels_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  return;
}

Assistant:

void TreeEnsembleClassifier::InternalSwap(TreeEnsembleClassifier* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(TreeEnsembleClassifier, postevaluationtransform_)
      + sizeof(TreeEnsembleClassifier::postevaluationtransform_)
      - PROTOBUF_FIELD_OFFSET(TreeEnsembleClassifier, treeensemble_)>(
          reinterpret_cast<char*>(&treeensemble_),
          reinterpret_cast<char*>(&other->treeensemble_));
  swap(ClassLabels_, other->ClassLabels_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
}